

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O1

XML_Bool poolGrow(STRING_POOL *pool)

{
  block *pbVar1;
  XML_Char *pXVar2;
  int iVar3;
  BLOCK *pBVar4;
  XML_Char *pXVar5;
  int iVar6;
  ulong uVar7;
  size_t sVar8;
  uint uVar9;
  
  pBVar4 = pool->freeBlocks;
  if (pBVar4 == (BLOCK *)0x0) {
LAB_0017188e:
    pBVar4 = pool->blocks;
    if ((pBVar4 == (BLOCK *)0x0) || (pXVar5 = pool->start, pXVar5 != pBVar4->s)) {
      iVar3 = *(int *)&pool->end - *(int *)&pool->start;
      if ((-1 < iVar3) && ((uVar9 = 0x400, iVar3 < 0x400 || (uVar9 = iVar3 * 2, -1 < (int)uVar9))))
      {
        iVar6 = uVar9 + 0xc;
        if ((int)(uVar9 + 0xc) < 1) {
          iVar6 = 0;
        }
        iVar3 = 0;
        if (iVar6 == 0) goto LAB_001719d2;
        pBVar4 = (BLOCK *)(*pool->mem->malloc_fcn)((size_t)iVar6);
        if (pBVar4 != (BLOCK *)0x0) {
          pBVar4->size = uVar9;
          pBVar4->next = pool->blocks;
          pool->blocks = pBVar4;
          sVar8 = (long)pool->ptr - (long)pool->start;
          if (sVar8 != 0) {
            memcpy(pBVar4->s,pool->start,sVar8);
          }
          pool->ptr = pool->ptr + (0xc - (long)pool->start) + (long)(pBVar4->s + -0xc);
          pool->start = pBVar4->s;
          pXVar5 = pBVar4->s + ((ulong)uVar9 - 0xc);
          goto LAB_0017193a;
        }
      }
    }
    else {
      uVar9 = (*(int *)&pool->end - (int)pXVar5) * 2;
      iVar3 = 0;
      if ((int)uVar9 < 0) goto LAB_001719d2;
      iVar6 = uVar9 + 0xc;
      if ((int)(uVar9 + 0xc) < 1) {
        iVar6 = 0;
      }
      iVar3 = 0;
      if (iVar6 == 0 || uVar9 == 0) goto LAB_001719d2;
      pXVar2 = pool->ptr;
      pBVar4 = (BLOCK *)(*pool->mem->realloc_fcn)(pBVar4,(size_t)iVar6);
      if (pBVar4 != (BLOCK *)0x0) {
        pool->blocks = pBVar4;
        pBVar4->size = uVar9;
        pool->ptr = pXVar2 + (long)pBVar4 + (0xc - (long)pXVar5);
        pool->start = pBVar4->s;
        uVar7 = (ulong)uVar9;
        goto LAB_00171882;
      }
    }
    iVar3 = 0;
  }
  else {
    pXVar5 = pool->start;
    if (pXVar5 == (XML_Char *)0x0) {
      pool->blocks = pBVar4;
      pool->freeBlocks = pBVar4->next;
      pBVar4->next = (block *)0x0;
      pool->start = pBVar4->s;
      pool->end = pBVar4->s + pBVar4->size;
      pool->ptr = pBVar4->s;
    }
    else {
      sVar8 = (long)pool->end - (long)pXVar5;
      if ((long)pBVar4->size <= (long)sVar8) goto LAB_0017188e;
      pbVar1 = pBVar4->next;
      pBVar4->next = pool->blocks;
      pool->blocks = pBVar4;
      pool->freeBlocks = pbVar1;
      memcpy(pBVar4->s,pXVar5,sVar8);
      pBVar4 = pool->blocks;
      pool->ptr = pool->ptr + (long)pBVar4 + (0xc - (long)pool->start);
      pool->start = pBVar4->s;
      uVar7 = (ulong)pBVar4->size;
LAB_00171882:
      pXVar5 = pBVar4->s + (uVar7 - 0xc);
LAB_0017193a:
      pool->end = pXVar5 + 0xc;
    }
    iVar3 = 1;
  }
LAB_001719d2:
  return (XML_Bool)iVar3;
}

Assistant:

static XML_Bool FASTCALL
poolGrow(STRING_POOL *pool) {
  if (pool->freeBlocks) {
    if (pool->start == 0) {
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = pool->freeBlocks->next;
      pool->blocks->next = NULL;
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      pool->ptr = pool->start;
      return XML_TRUE;
    }
    if (pool->end - pool->start < pool->freeBlocks->size) {
      BLOCK *tem = pool->freeBlocks->next;
      pool->freeBlocks->next = pool->blocks;
      pool->blocks = pool->freeBlocks;
      pool->freeBlocks = tem;
      memcpy(pool->blocks->s, pool->start,
             (pool->end - pool->start) * sizeof(XML_Char));
      pool->ptr = pool->blocks->s + (pool->ptr - pool->start);
      pool->start = pool->blocks->s;
      pool->end = pool->start + pool->blocks->size;
      return XML_TRUE;
    }
  }
  if (pool->blocks && pool->start == pool->blocks->s) {
    BLOCK *temp;
    int blockSize = (int)((unsigned)(pool->end - pool->start) * 2U);
    size_t bytesToAllocate;

    /* NOTE: Needs to be calculated prior to calling `realloc`
             to avoid dangling pointers: */
    const ptrdiff_t offsetInsideBlock = pool->ptr - pool->start;

    if (blockSize < 0) {
      /* This condition traps a situation where either more than
       * INT_MAX/2 bytes have already been allocated.  This isn't
       * readily testable, since it is unlikely that an average
       * machine will have that much memory, so we exclude it from the
       * coverage statistics.
       */
      return XML_FALSE; /* LCOV_EXCL_LINE */
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    temp = (BLOCK *)pool->mem->realloc_fcn(pool->blocks,
                                           (unsigned)bytesToAllocate);
    if (temp == NULL)
      return XML_FALSE;
    pool->blocks = temp;
    pool->blocks->size = blockSize;
    pool->ptr = pool->blocks->s + offsetInsideBlock;
    pool->start = pool->blocks->s;
    pool->end = pool->start + blockSize;
  } else {
    BLOCK *tem;
    int blockSize = (int)(pool->end - pool->start);
    size_t bytesToAllocate;

    if (blockSize < 0) {
      /* This condition traps a situation where either more than
       * INT_MAX bytes have already been allocated (which is prevented
       * by various pieces of program logic, not least this one, never
       * mind the unlikelihood of actually having that much memory) or
       * the pool control fields have been corrupted (which could
       * conceivably happen in an extremely buggy user handler
       * function).  Either way it isn't readily testable, so we
       * exclude it from the coverage statistics.
       */
      return XML_FALSE; /* LCOV_EXCL_LINE */
    }

    if (blockSize < INIT_BLOCK_SIZE)
      blockSize = INIT_BLOCK_SIZE;
    else {
      /* Detect overflow, avoiding _signed_ overflow undefined behavior */
      if ((int)((unsigned)blockSize * 2U) < 0) {
        return XML_FALSE;
      }
      blockSize *= 2;
    }

    bytesToAllocate = poolBytesToAllocateFor(blockSize);
    if (bytesToAllocate == 0)
      return XML_FALSE;

    tem = pool->mem->malloc_fcn(bytesToAllocate);
    if (! tem)
      return XML_FALSE;
    tem->size = blockSize;
    tem->next = pool->blocks;
    pool->blocks = tem;
    if (pool->ptr != pool->start)
      memcpy(tem->s, pool->start, (pool->ptr - pool->start) * sizeof(XML_Char));
    pool->ptr = tem->s + (pool->ptr - pool->start);
    pool->start = tem->s;
    pool->end = tem->s + blockSize;
  }
  return XML_TRUE;
}